

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O0

void __thiscall DelaunayMST::add(DelaunayMST *this,int x,int y)

{
  int iVar1;
  type piVar2;
  type pEVar3;
  size_t __i;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar5;
  
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
  iVar4 = *piVar2;
  *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 1;
  pEVar3 = std::unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
           ::operator[]((unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
                         *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8);
  pEVar3->to = in_EDX;
  pEVar3->prev = iVar4;
  pEVar3->next = 0;
  iVar4 = *(int *)(in_RDI + 0x40);
  __i = in_RDI + 0x20;
  std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,iVar4),__i);
  pEVar3 = std::unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
           ::operator[]((unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
                         *)CONCAT44(in_stack_ffffffffffffffb4,iVar4),__i);
  pEVar3->next = iVar4;
  iVar5 = *(int *)(in_RDI + 0x40);
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     ((unique_ptr<int[],_std::default_delete<int[]>_> *)CONCAT44(iVar5,iVar4),__i);
  *piVar2 = iVar5;
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     ((unique_ptr<int[],_std::default_delete<int[]>_> *)CONCAT44(iVar5,iVar4),__i);
  iVar1 = *piVar2;
  *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 1;
  pEVar3 = std::unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
           ::operator[]((unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
                         *)CONCAT44(iVar5,iVar4),__i);
  pEVar3->to = in_ESI;
  pEVar3->prev = iVar1;
  pEVar3->next = 0;
  iVar1 = *(int *)(in_RDI + 0x40);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)CONCAT44(iVar5,iVar4),__i);
  pEVar3 = std::unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
           ::operator[]((unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
                         *)CONCAT44(iVar5,iVar4),__i);
  pEVar3->next = iVar1;
  iVar1 = *(int *)(in_RDI + 0x40);
  piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     ((unique_ptr<int[],_std::default_delete<int[]>_> *)CONCAT44(iVar5,iVar4),__i);
  *piVar2 = iVar1;
  return;
}

Assistant:

void add(int x, int y)
	{
		e[++eCnt] = {y, last[x]};
		e[last[x]].next = eCnt, last[x] = eCnt;
		e[++eCnt] = {x, last[y]};
		e[last[y]].next = eCnt, last[y] = eCnt;
	}